

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
hmac_hash::sha1(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
               void *data,size_t length)

{
  uint8_t *digest;
  value_type_conflict *__val;
  SHA1 local_58;
  
  digest = (uint8_t *)operator_new(0x14);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = digest;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = digest + 0x14;
  digest[0] = '\0';
  digest[1] = '\0';
  digest[2] = '\0';
  digest[3] = '\0';
  digest[4] = '\0';
  digest[5] = '\0';
  digest[6] = '\0';
  digest[7] = '\0';
  digest[8] = '\0';
  digest[9] = '\0';
  digest[10] = '\0';
  digest[0xb] = '\0';
  digest[0xc] = '\0';
  digest[0xd] = '\0';
  digest[0xe] = '\0';
  digest[0xf] = '\0';
  digest[0x10] = '\0';
  digest[0x11] = '\0';
  digest[0x12] = '\0';
  digest[0x13] = '\0';
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = digest + 0x14;
  local_58.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_h[0] = 0x67452301;
  local_58.m_h[1] = 0xefcdab89;
  local_58.m_h[2] = 0x98badcfe;
  local_58.m_h[3] = 0x10325476;
  local_58.m_h[4] = 0xc3d2e1f0;
  local_58.m_transforms = 0;
  SHA1::update(&local_58,(uchar *)data,length);
  SHA1::finish(&local_58,digest);
  if (local_58.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.m_buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> sha1(const void* data, size_t length) {
        std::vector<uint8_t> digest(hmac_hash::SHA1::DIGEST_SIZE);
        hmac_hash::SHA1 ctx;
        ctx.init();
        ctx.update(reinterpret_cast<const uint8_t*>(data), length);
        ctx.finish(digest.data());
        return digest;
    }